

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

void tt_face_free_name(TT_Face face)

{
  FT_Memory memory;
  TT_NameRec *pTVar1;
  TT_LangTagRec *pTVar2;
  TT_Name entry;
  TT_NameRec *pTVar3;
  TT_LangTagRec *pTVar4;
  
  pTVar3 = (face->name_table).names;
  memory = (((face->root).driver)->root).memory;
  if (pTVar3 != (TT_NameRec *)0x0) {
    pTVar1 = pTVar3 + (face->name_table).numNameRecords;
    for (; pTVar3 < pTVar1; pTVar3 = pTVar3 + 1) {
      ft_mem_free(memory,pTVar3->string);
      pTVar3->string = (FT_Byte *)0x0;
    }
    ft_mem_free(memory,(face->name_table).names);
    (face->name_table).names = (TT_NameRec *)0x0;
  }
  pTVar4 = (face->name_table).langTags;
  if (pTVar4 != (TT_LangTagRec *)0x0) {
    pTVar2 = pTVar4 + (face->name_table).numLangTagRecords;
    for (; pTVar4 < pTVar2; pTVar4 = pTVar4 + 1) {
      ft_mem_free(memory,pTVar4->string);
      pTVar4->string = (FT_Byte *)0x0;
    }
    ft_mem_free(memory,(face->name_table).langTags);
    (face->name_table).langTags = (TT_LangTagRec *)0x0;
  }
  (face->name_table).numNameRecords = 0;
  (face->name_table).storageOffset = 0;
  (face->name_table).numLangTagRecords = 0;
  (face->name_table).format = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_name( TT_Face  face )
  {
    FT_Memory     memory = face->root.driver->root.memory;
    TT_NameTable  table  = &face->name_table;


    if ( table->names )
    {
      TT_Name  entry = table->names;
      TT_Name  limit = entry + table->numNameRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->names );
    }

    if ( table->langTags )
    {
      TT_LangTag  entry = table->langTags;
      TT_LangTag  limit = entry + table->numLangTagRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->langTags );
    }

    table->numNameRecords    = 0;
    table->numLangTagRecords = 0;
    table->format            = 0;
    table->storageOffset     = 0;
  }